

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall
QPDFWriter::writeObject(QPDFWriter *this,QPDFObjectHandle *object,int object_stream_index)

{
  int iVar1;
  element_type *peVar2;
  size_type sVar3;
  Object *pOVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  bool bVar7;
  string local_1d8;
  string_view local_1b8;
  string_view local_1a8;
  string_view local_198;
  QPDFObjectHandle local_188;
  QPDFObjectHandle local_178;
  QPDFObjGen local_168;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string_view local_100;
  string_view local_f0;
  string local_e0;
  string_view local_c0;
  string_view local_b0;
  string_view local_a0;
  string local_90;
  string_view local_70;
  string_view local_60;
  QPDFObjGen local_50;
  int local_48;
  int new_id;
  QPDFObjectHandle local_38;
  int local_28;
  QPDFObjGen local_24;
  QPDFObjGen old_og;
  int object_stream_index_local;
  QPDFObjectHandle *object_local;
  QPDFWriter *this_local;
  
  old_og.obj = object_stream_index;
  unique0x100009f0 = object;
  local_24 = QPDFObjectHandle::getObjGen(object);
  bVar7 = false;
  if (old_og.obj == -1) {
    iVar1 = QPDFObjGen::getGen(&local_24);
    bVar7 = false;
    if (iVar1 == 0) {
      peVar2 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      local_28 = QPDFObjGen::getObj(&local_24);
      sVar3 = std::
              map<int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>_>_>
              ::count(&peVar2->object_stream_to_objects,&local_28);
      bVar7 = sVar3 != 0;
    }
  }
  if (bVar7) {
    QPDFObjectHandle::QPDFObjectHandle(&local_38,object);
    writeObjectStream(this,&local_38);
    QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  }
  else {
    indicateProgress(this,false,false);
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_50 = local_24;
    pOVar4 = ObjTable<QPDFWriter::Object>::operator[]
                       (&(peVar2->obj).super_ObjTable<QPDFWriter::Object>,local_24);
    local_48 = pOVar4->renumber;
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    if ((peVar2->qdf_mode & 1U) != 0) {
      peVar2 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      sVar5 = std::
              map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
              ::count(&peVar2->page_object_to_seq,&local_24);
      if (sVar5 != 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_60,"%% Page ");
        writeString(this,local_60);
        peVar2 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        pmVar6 = std::
                 map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                 ::operator[](&peVar2->page_object_to_seq,&local_24);
        std::__cxx11::to_string(&local_90,*pmVar6);
        local_70 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_90);
        writeString(this,local_70);
        std::__cxx11::string::~string((string *)&local_90);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a0,"\n");
        writeString(this,local_a0);
      }
      peVar2 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      sVar5 = std::
              map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
              ::count(&peVar2->contents_to_page_seq,&local_24);
      if (sVar5 != 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_b0,"%% Contents for page ");
        writeString(this,local_b0);
        peVar2 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        pmVar6 = std::
                 map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                 ::operator[](&peVar2->contents_to_page_seq,&local_24);
        std::__cxx11::to_string(&local_e0,*pmVar6);
        local_c0 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_e0);
        writeString(this,local_c0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f0,"\n");
        writeString(this,local_f0);
      }
    }
    if (old_og.obj == -1) {
      peVar2 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      if ((peVar2->qdf_mode & 1U) != 0) {
        peVar2 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        if ((peVar2->suppress_original_object_ids & 1U) == 0) {
          local_168 = QPDFObjectHandle::getObjGen(object);
          QPDFObjGen::unparse_abi_cxx11_(&local_160,&local_168,' ');
          std::operator+(&local_140,"%% Original object ID: ",&local_160);
          std::operator+(&local_120,&local_140,"\n");
          local_100 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_120)
          ;
          writeString(this,local_100);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_140);
          std::__cxx11::string::~string((string *)&local_160);
        }
      }
      openObject(this,local_48);
      setDataKey(this,local_48);
      QPDFObjectHandle::QPDFObjectHandle(&local_178,object);
      unparseObject(this,&local_178,0,0,0,false);
      QPDFObjectHandle::~QPDFObjectHandle(&local_178);
      std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)this);
      std::__cxx11::string::clear();
      closeObject(this,local_48);
    }
    else {
      QPDFObjectHandle::QPDFObjectHandle(&local_188,object);
      unparseObject(this,&local_188,0,4,0,false);
      QPDFObjectHandle::~QPDFObjectHandle(&local_188);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_198,"\n");
      writeString(this,local_198);
    }
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    if ((peVar2->direct_stream_lengths & 1U) == 0) {
      bVar7 = QPDFObjectHandle::isStream(object);
      if (bVar7) {
        peVar2 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        if ((peVar2->qdf_mode & 1U) != 0) {
          peVar2 = std::
                   __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          if ((peVar2->added_newline & 1U) != 0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_1a8,"%QDF: ignore_newline\n");
            writeString(this,local_1a8);
          }
        }
        openObject(this,local_48 + 1);
        peVar2 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        std::__cxx11::to_string(&local_1d8,peVar2->cur_stream_length);
        local_1b8 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1d8);
        writeString(this,local_1b8);
        std::__cxx11::string::~string((string *)&local_1d8);
        closeObject(this,local_48 + 1);
      }
    }
  }
  return;
}

Assistant:

void
QPDFWriter::writeObject(QPDFObjectHandle object, int object_stream_index)
{
    QPDFObjGen old_og = object.getObjGen();

    if ((object_stream_index == -1) && (old_og.getGen() == 0) &&
        (m->object_stream_to_objects.count(old_og.getObj()))) {
        writeObjectStream(object);
        return;
    }

    indicateProgress(false, false);
    auto new_id = m->obj[old_og].renumber;
    if (m->qdf_mode) {
        if (m->page_object_to_seq.count(old_og)) {
            writeString("%% Page ");
            writeString(std::to_string(m->page_object_to_seq[old_og]));
            writeString("\n");
        }
        if (m->contents_to_page_seq.count(old_og)) {
            writeString("%% Contents for page ");
            writeString(std::to_string(m->contents_to_page_seq[old_og]));
            writeString("\n");
        }
    }
    if (object_stream_index == -1) {
        if (m->qdf_mode && (!m->suppress_original_object_ids)) {
            writeString("%% Original object ID: " + object.getObjGen().unparse(' ') + "\n");
        }
        openObject(new_id);
        setDataKey(new_id);
        unparseObject(object, 0, 0);
        m->cur_data_key.clear();
        closeObject(new_id);
    } else {
        unparseObject(object, 0, f_in_ostream);
        writeString("\n");
    }

    if ((!m->direct_stream_lengths) && object.isStream()) {
        if (m->qdf_mode) {
            if (m->added_newline) {
                writeString("%QDF: ignore_newline\n");
            }
        }
        openObject(new_id + 1);
        writeString(std::to_string(m->cur_stream_length));
        closeObject(new_id + 1);
    }
}